

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O0

bool __thiscall
spvtools::val::ValidationState_t::ContainsType
          (ValidationState_t *this,uint32_t id,
          function<bool_(const_spvtools::val::Instruction_*)> *f,bool traverse_all_types)

{
  bool bVar1;
  Op OVar2;
  uint uVar3;
  Instruction *__args;
  vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_> *this_00;
  size_type sVar4;
  uint local_3c;
  uint32_t i;
  Instruction *inst;
  bool traverse_all_types_local;
  function<bool_(const_spvtools::val::Instruction_*)> *f_local;
  uint32_t id_local;
  ValidationState_t *this_local;
  
  __args = FindDef(this,id);
  if (__args == (Instruction *)0x0) {
    return false;
  }
  bVar1 = std::function<bool_(const_spvtools::val::Instruction_*)>::operator()(f,__args);
  if (bVar1) {
    return true;
  }
  OVar2 = Instruction::opcode(__args);
  if ((OVar2 - OpTypeVector < 3) || (OVar2 - OpTypeSampledImage < 3)) {
LAB_005c3e93:
    uVar3 = Instruction::GetOperandAs<unsigned_int>(__args,1);
    bVar1 = ContainsType(this,uVar3,f,traverse_all_types);
    return bVar1;
  }
  if (OVar2 != OpTypeStruct) {
    if (OVar2 == OpTypePointer) {
      bVar1 = IsForwardPointer(this,id);
      if (bVar1) {
        return false;
      }
      if (!traverse_all_types) {
        return false;
      }
      uVar3 = Instruction::GetOperandAs<unsigned_int>(__args,2);
      bVar1 = ContainsType(this,uVar3,f,traverse_all_types);
      return bVar1;
    }
    if (OVar2 != OpTypeFunction) {
      if ((OVar2 != OpTypeCooperativeMatrixKHR) && (OVar2 != OpTypeCooperativeMatrixNV)) {
        return false;
      }
      goto LAB_005c3e93;
    }
  }
  OVar2 = Instruction::opcode(__args);
  if ((OVar2 == OpTypeFunction) && (!traverse_all_types)) {
    return false;
  }
  local_3c = 1;
  while( true ) {
    this_00 = Instruction::operands(__args);
    sVar4 = std::vector<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>::size(this_00);
    if (sVar4 <= local_3c) {
      return false;
    }
    uVar3 = Instruction::GetOperandAs<unsigned_int>(__args,(ulong)local_3c);
    bVar1 = ContainsType(this,uVar3,f,traverse_all_types);
    if (bVar1) break;
    local_3c = local_3c + 1;
  }
  return true;
}

Assistant:

bool ValidationState_t::ContainsType(
    uint32_t id, const std::function<bool(const Instruction*)>& f,
    bool traverse_all_types) const {
  const auto inst = FindDef(id);
  if (!inst) return false;

  if (f(inst)) return true;

  switch (inst->opcode()) {
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      return ContainsType(inst->GetOperandAs<uint32_t>(1u), f,
                          traverse_all_types);
    case spv::Op::OpTypePointer:
      if (IsForwardPointer(id)) return false;
      if (traverse_all_types) {
        return ContainsType(inst->GetOperandAs<uint32_t>(2u), f,
                            traverse_all_types);
      }
      break;
    case spv::Op::OpTypeFunction:
    case spv::Op::OpTypeStruct:
      if (inst->opcode() == spv::Op::OpTypeFunction && !traverse_all_types) {
        return false;
      }
      for (uint32_t i = 1; i < inst->operands().size(); ++i) {
        if (ContainsType(inst->GetOperandAs<uint32_t>(i), f,
                         traverse_all_types)) {
          return true;
        }
      }
      break;
    default:
      break;
  }

  return false;
}